

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_panic.c
# Opt level: O2

void writestr(int fd,char *s)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  char *__s;
  undefined4 in_register_0000003c;
  int iVar5;
  
  __s = (char *)CONCAT44(in_register_0000003c,fd);
  sVar2 = strlen(__s);
  uVar3 = 0;
  do {
    iVar5 = (int)sVar2;
    while( true ) {
      if ((iVar5 == 0) || ((int)uVar3 < 0)) {
        return;
      }
      uVar3 = write(2,__s,(long)iVar5);
      uVar1 = (uint)uVar3;
      if (-1 < (int)uVar1) break;
      if (uVar1 == 0xffffffff) {
        piVar4 = __errno_location();
        uVar3 = (ulong)-(uint)(*piVar4 != 4);
      }
    }
    sVar2 = (size_t)(iVar5 - uVar1);
    __s = __s + (uVar1 & 0x7fffffff);
  } while( true );
}

Assistant:

NSYNC_CPP_START_

/* Write the nul-terminated string s[] to file descriptor fd. */
static void writestr (int fd, const char *s) {
        int len = strlen (s);
        int n = 0;
        while (len != 0 && n >= 0) {
                n = write (fd, s, len);
                if (n >= 0) {
                        len -= n;
                        s += n;
                } else if (n == -1 && errno == EINTR) {
                        n = 0;
                }
        }
}